

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall
shaping_clipper::feed
          (shaping_clipper *this,float *in_samples,float *out_samples,bool diff_only,
          float *total_margin_shift)

{
  uint uVar1;
  PFFFT_Setup *pPVar2;
  undefined8 uVar3;
  int i;
  int iVar4;
  long lVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  long lVar7;
  float fVar8;
  float *mask_curve;
  pointer pfVar9;
  float *pfVar10;
  shaping_clipper *psVar11;
  pointer pfVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  float *pfVar17;
  float *in_frame;
  float *out_frame;
  bool bVar18;
  float delta_boost;
  float fVar19;
  float fVar20;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar21;
  float afStack_90 [6];
  float *local_78;
  float *local_70;
  float *local_68;
  float local_60;
  float local_5c;
  float local_58;
  undefined4 local_54;
  float diff_needed;
  undefined4 uStack_4c;
  float *local_48;
  PFFFT_Setup *local_40;
  shaping_clipper *local_38;
  
  local_48 = total_margin_shift;
  local_54 = (int)CONCAT71(in_register_00000009,diff_only);
  local_68 = out_samples;
  iVar4 = this->size;
  uVar1 = this->overlap;
  uVar15 = iVar4 - uVar1;
  pfVar9 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar12 = (this->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar13 = 0;
  if (0 < (int)uVar15) {
    uVar13 = (ulong)uVar15;
  }
  while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
    *pfVar9 = pfVar9[(int)uVar1];
    *pfVar12 = pfVar12[(int)uVar1];
    pfVar9 = pfVar9 + 1;
    pfVar12 = pfVar12 + 1;
  }
  pfVar10 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar9 = (this->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = 0;
  uVar13 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar13 = uVar14;
  }
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    iVar16 = uVar15 + (int)uVar14;
    pfVar10[iVar16] = in_samples[uVar14];
    pfVar9[iVar16] = 0.0;
  }
  uVar13 = (long)this->oversample * (long)iVar4 * 4 + 0xfU & 0xfffffffffffffff0;
  out_frame = (float *)((long)afStack_90 + (8 - uVar13));
  in_frame = (float *)((long)out_frame - uVar13);
  pfVar17 = (float *)((long)in_frame - uVar13);
  pfVar17[-2] = 2.8026e-45;
  pfVar17[-1] = 0.0;
  mask_curve = (float *)((long)pfVar17 -
                        ((long)(iVar4 / (int)*(undefined8 *)(pfVar17 + -2)) * 4 + 0x13U &
                        0xfffffffffffffff0));
  uVar13 = 0;
  local_38 = this;
  mask_curve[-2] = 1.495963e-39;
  mask_curve[-1] = 0.0;
  apply_window(this,pfVar10,out_frame,false);
  pPVar2 = local_38->pffft;
  mask_curve[-2] = 1.495997e-39;
  mask_curve[-1] = 0.0;
  pffft_transform_ordered(pPVar2,out_frame,pfVar17,(float *)0x0,PFFFT_FORWARD);
  psVar11 = local_38;
  mask_curve[-2] = 1.496018e-39;
  mask_curve[-1] = 0.0;
  calculate_mask_curve(psVar11,pfVar17,mask_curve);
  uVar1 = local_38->size;
  iVar4 = local_38->oversample;
  uVar15 = iVar4 * uVar1;
  fVar8 = (float)(local_38->max_oversample / iVar4);
  local_78 = pfVar17;
  if (iVar4 < 2) {
    local_40 = local_38->pffft;
    pfVar10 = local_48;
    psVar11 = local_38;
    if (0 < (int)uVar15) {
      uVar13 = (ulong)uVar15;
    }
  }
  else {
    lVar5 = (long)(int)uVar1;
    local_40 = local_38->pffft_oversampled;
    pfVar17[lVar5] = pfVar17[1] * 0.5;
    pfVar17[1] = 0.0;
    while (lVar5 = lVar5 + 1, lVar5 < (int)uVar15) {
      pfVar17[lVar5] = 0.0;
    }
    _diff_needed = CONCAT44(uStack_4c,fVar8);
    uVar14 = 0;
    mask_curve[-2] = 1.4013e-45;
    pPVar2 = local_40;
    mask_curve[-1] = 0.0;
    uVar3 = *(undefined8 *)(mask_curve + -2);
    mask_curve[-2] = 1.496221e-39;
    mask_curve[-1] = 0.0;
    pffft_transform_ordered(pPVar2,pfVar17,out_frame,(float *)0x0,(pffft_direction_t)uVar3);
    psVar11 = local_38;
    pfVar10 = local_48;
    uVar1 = local_38->size;
    uVar13 = 0;
    if (0 < (int)uVar15) {
      uVar13 = (ulong)uVar15;
    }
    for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      out_frame[uVar14] = out_frame[uVar14] / (float)(int)uVar1;
    }
    mask_curve[-2] = 2.8026e-45;
    mask_curve[-1] = 0.0;
    iVar16 = (int)uVar1 / (int)*(undefined8 *)(mask_curve + -2);
    iVar4 = psVar11->oversample;
    mask_curve[-2] = -NAN;
    mask_curve[-1] = -NAN;
    if (iVar16 < 0) {
      iVar16 = (int)*(undefined8 *)(mask_curve + -2);
    }
    for (uVar14 = 0; iVar16 + 1 != uVar14; uVar14 = uVar14 + 1) {
      mask_curve[uVar14] = mask_curve[uVar14] * (float)iVar4;
    }
    fVar8 = diff_needed;
  }
  pfVar17 = (psVar11->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = 0.0;
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    fVar19 = ABS(out_frame[uVar14] * *pfVar17);
    if (ABS(out_frame[uVar14] * *pfVar17) <= fVar21) {
      fVar19 = fVar21;
    }
    fVar21 = fVar19;
    pfVar17 = pfVar17 + (int)fVar8;
  }
  fVar19 = psVar11->clip_level;
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    in_frame[uVar14] = 0.0;
  }
  fVar21 = fVar21 / fVar19;
  if (pfVar10 != (float *)0x0) {
    *pfVar10 = 1.0;
  }
  local_58 = fVar21 + -1.0;
  uVar14 = 0;
  local_70 = out_frame;
  local_60 = fVar21;
  local_5c = (float)(int)uVar15;
  while( true ) {
    fVar20 = (float)(int)uVar14;
    fVar19 = psVar11->iterations;
    if (fVar19 <= fVar20) break;
    delta_boost = 2.0;
    if (fVar20 < fVar19 / -3.0 + fVar19 || 2.0 <= fVar21) {
      delta_boost = 1.0;
    }
    afStack_90[2] = fVar20;
    afStack_90[3] = (float)in_XMM3_Db;
    afStack_90[4] = (float)in_XMM3_Dc;
    afStack_90[5] = (float)in_XMM3_Dd;
    _diff_needed = uVar14;
    mask_curve[-2] = 1.496697e-39;
    mask_curve[-1] = 0.0;
    clip_to_window(psVar11,out_frame,in_frame,delta_boost);
    pPVar2 = local_40;
    pfVar10 = local_78;
    mask_curve[-2] = 1.496731e-39;
    mask_curve[-1] = 0.0;
    pffft_transform_ordered(pPVar2,in_frame,pfVar10,(float *)0x0,PFFFT_FORWARD);
    psVar11 = local_38;
    iVar4 = local_38->oversample;
    if (1 < (long)iVar4) {
      pfVar10[1] = 0.0;
      lVar7 = (long)psVar11->size;
      lVar5 = iVar4 * lVar7;
      while (lVar7 = lVar7 + 1, lVar7 < lVar5) {
        pfVar10[lVar7] = 0.0;
      }
    }
    mask_curve[-2] = 1.496804e-39;
    mask_curve[-1] = 0.0;
    limit_clip_spectrum(psVar11,pfVar10,mask_curve);
    pPVar2 = local_40;
    mask_curve[-2] = 1.4013e-45;
    mask_curve[-1] = 0.0;
    uVar3 = *(undefined8 *)(mask_curve + -2);
    mask_curve[-2] = 1.496833e-39;
    mask_curve[-1] = 0.0;
    pffft_transform_ordered(pPVar2,pfVar10,in_frame,(float *)0x0,(pffft_direction_t)uVar3);
    pfVar10 = local_48;
    uVar14 = _diff_needed;
    fVar21 = local_5c;
    fVar19 = local_60;
    out_frame = local_70;
    for (uVar6 = 0; psVar11 = local_38, uVar13 != uVar6; uVar6 = uVar6 + 1) {
      in_frame[uVar6] = in_frame[uVar6] / fVar21;
    }
    pfVar17 = (local_38->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    fVar21 = 0.0;
    for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
      fVar20 = ABS((out_frame[uVar6] + in_frame[uVar6]) * *pfVar17);
      if (fVar20 <= fVar21) {
        fVar20 = fVar21;
      }
      fVar21 = fVar20;
      pfVar17 = pfVar17 + (int)fVar8;
    }
    fVar21 = fVar21 / local_38->clip_level;
    fVar20 = 1.122;
    if ((1.0 < fVar19) && (fVar20 = 1.122, 1.0 < fVar21)) {
      fVar19 = fVar19 - fVar21;
      in_XMM3_Db = 0;
      in_XMM3_Dc = 0;
      in_XMM3_Dd = 0;
      fVar20 = fVar21;
      if ((0.0 < fVar19) &&
         (((float)((int)uVar14 + 1) < local_38->iterations + local_38->iterations / -3.0 &&
          (fVar19 = local_58 / fVar19, fVar19 <= fVar21)))) {
        fVar20 = fVar19;
      }
      if (fVar20 <= 1.122) {
        fVar20 = 1.122;
      }
    }
    fVar19 = local_38->adaptive_distortion_strength * (fVar20 + -1.0) + 1.0;
    if (((pfVar10 != (float *)0x0) && (1.01 < fVar21)) &&
       (afStack_90[2] < local_38->iterations + -1.0)) {
      *pfVar10 = *pfVar10 * fVar19;
    }
    uVar1 = local_38->size;
    mask_curve[-2] = 2.8026e-45;
    mask_curve[-1] = 0.0;
    iVar4 = (int)uVar1 / (int)*(undefined8 *)(mask_curve + -2);
    mask_curve[-2] = -NAN;
    mask_curve[-1] = -NAN;
    if (iVar4 < 0) {
      iVar4 = (int)*(undefined8 *)(mask_curve + -2);
    }
    for (uVar6 = 0; iVar4 + 1 != uVar6; uVar6 = uVar6 + 1) {
      mask_curve[uVar6] = mask_curve[uVar6] * fVar19;
    }
    uVar14 = (ulong)((int)uVar14 + 1);
  }
  iVar4 = psVar11->oversample;
  if (1 < (long)iVar4) {
    lVar5 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
      in_frame[uVar13] = in_frame[lVar5];
      lVar5 = lVar5 + iVar4;
    }
  }
  pfVar10 = (psVar11->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  mask_curve[-2] = 1.4013e-45;
  mask_curve[-1] = 0.0;
  uVar3 = *(undefined8 *)(mask_curve + -2);
  mask_curve[-2] = 1.497433e-39;
  mask_curve[-1] = 0.0;
  apply_window(psVar11,in_frame,pfVar10,SUB81(uVar3,0));
  pfVar9 = (local_38->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = 0;
  uVar13 = (ulong)(uint)local_38->overlap;
  if (local_38->overlap < 1) {
    uVar13 = uVar14;
  }
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    local_68[uVar14] = pfVar9[uVar14] / 1.5;
  }
  if (1 < local_38->oversample) {
    fVar8 = 0.0;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      fVar21 = ABS(local_68[uVar14]);
      if (ABS(local_68[uVar14]) <= fVar8) {
        fVar21 = fVar8;
      }
      fVar8 = fVar21;
    }
    if (fVar8 < local_38->clip_level * 0.001) {
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        local_68[uVar14] = 0.0;
      }
    }
  }
  if ((char)local_54 == '\0') {
    pfVar9 = (local_38->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      local_68[uVar14] = pfVar9[uVar14] + local_68[uVar14];
    }
  }
  return;
}

Assistant:

void shaping_clipper::feed(const float* in_samples, float* out_samples, bool diff_only, float* total_margin_shift) {
    // shift in/out buffers
    for (int i = 0; i < this->size - this->overlap; i++) {
        this->in_frame[i] = this->in_frame[i + this->overlap];
        this->out_dist_frame[i] = this->out_dist_frame[i + this->overlap];
    }
    for (int i = 0; i < this->overlap; i++) {
        this->in_frame[i + this->size - this->overlap] = in_samples[i];
        this->out_dist_frame[i + this->size - this->overlap] = 0;
    }

    float peak;
    float* windowed_frame = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* clipping_delta = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* spectrum_buf = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* mask_curve = (float*)alloca(sizeof(float) * (this->size / 2 + 1));

    apply_window(this->in_frame.data(), windowed_frame);
    pffft_transform_ordered(this->pffft, windowed_frame, spectrum_buf, NULL, PFFFT_FORWARD);
    calculate_mask_curve(spectrum_buf, mask_curve);

    int clipping_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    PFFFT_Setup* clipping_pffft = this->pffft;
    if (this->oversample > 1) {
        clipping_pffft = this->pffft_oversampled;

        // use IFFT to oversample the windowed frame
        spectrum_buf[this->size] = spectrum_buf[1] / 2;
        spectrum_buf[1] = 0;
        for (int i = this->size + 1; i < this->size * this->oversample; i++) {
            spectrum_buf[i] = 0;
        }
        pffft_transform_ordered(this->pffft_oversampled, spectrum_buf, windowed_frame, NULL, PFFFT_BACKWARD);
        float fft_ifft_scale = this->size;
        for (int i = 0; i < clipping_samples; i++) {
            windowed_frame[i] /= fft_ifft_scale;
        }

        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= this->oversample;
        }
    }

    float orig_peak = 0;
    for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
        orig_peak = std::max<float>(orig_peak, std::abs(windowed_frame[sample_idx] * inv_window[window_idx]));
    }
    orig_peak /= this->clip_level;
    peak = orig_peak;

    // clear clipping_delta
    for (int i = 0; i < clipping_samples; i++) {
        clipping_delta[i] = 0;
    }

    if (total_margin_shift) {
        *total_margin_shift = 1.0;
    }

    // repeat clipping-filtering process a few times to control both the peaks and the spectrum
    for (int i = 0; i < this->iterations; i++) {
        // The last 1/3 of rounds have boosted delta to help reach the peak target faster
        float delta_boost = 1.0;
        if (i >= this->iterations - this->iterations / 3) {
            // boosting the delta when largs peaks are still present is dangerous
            if (peak < 2.0) {
                delta_boost = 2.0;
            }
        }
        clip_to_window(windowed_frame, clipping_delta, delta_boost);

        pffft_transform_ordered(clipping_pffft, clipping_delta, spectrum_buf, NULL, PFFFT_FORWARD);

        if (this->oversample > 1) {
            // Zero out all frequency bins above the base nyquist rate.
            // limit_clip_spectrum doesn't handle these bins.
            spectrum_buf[1] = 0;
            for (int i = this->size + 1; i < this->size * this->oversample; i++) {
                spectrum_buf[i] = 0;
            }
        }

        limit_clip_spectrum(spectrum_buf, mask_curve);

        pffft_transform_ordered(clipping_pffft, spectrum_buf, clipping_delta, NULL, PFFFT_BACKWARD);
        // see pffft.h
        for (int i = 0; i < clipping_samples; i++) {
            clipping_delta[i] /= clipping_samples;
        }

        peak = 0;
        for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
            peak = std::max<float>(peak, std::abs((windowed_frame[sample_idx] + clipping_delta[sample_idx]) * inv_window[window_idx]));
        }
        peak /= this->clip_level;

        // Automatically adjust mask_curve as necessary to reach peak target
        float mask_curve_shift = 1.122; // 1.122 is 1dB
        if (orig_peak > 1.0 && peak > 1.0) {
            float diff_achieved = orig_peak - peak;
            if (i + 1 < this->iterations - this->iterations / 3 && diff_achieved > 0) {
                float diff_needed = orig_peak - 1.0;
                float diff_ratio = diff_needed / diff_achieved;
                // If a good amount of peak reduction was already achieved,
                // don't shift the mask_curve by the full peak value
                // On the other hand, if only a little peak reduction was achieved,
                // don't shift the mask_curve by the enormous diff_ratio.
                diff_ratio = std::min<float>(diff_ratio, peak);
                mask_curve_shift = std::max<float>(mask_curve_shift, diff_ratio);
            } else {
                // If the peak got higher than the input or we are in the last 1/3 rounds,
                // go back to the heavy-handed peak heuristic.
                mask_curve_shift = std::max<float>(mask_curve_shift, peak);
            }
        }

        mask_curve_shift = 1.0 + (mask_curve_shift - 1.0) * this->adaptive_distortion_strength;

        if (total_margin_shift && peak > 1.01 && i < this->iterations - 1) {
            *total_margin_shift *= mask_curve_shift;
        }

        // Be less strict in the next iteration.
        // This helps with peak control.
        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= mask_curve_shift;
        }
    }

    if (this->oversample > 1) {
        // Downsample back to original rate.
        // We already zeroed out all frequency bins above the base nyquist rate so we can simply drop samples here.
        for (int i = 0; i < this->size; i++) {
            clipping_delta[i] = clipping_delta[i * this->oversample];
        }
    }

    // do overlap & add
    apply_window(clipping_delta, this->out_dist_frame.data(), true);

    for (int i = 0; i < this->overlap; i++) {
        // 4 times overlap with squared hanning window results in 1.5 time increase in amplitude
        out_samples[i] = this->out_dist_frame[i] / 1.5;
    }

    if (this->oversample > 1) {
        // When oversampling is active, the clipping delta can be non-zero even if all the samples in the frame are well below the threshold.
        // This is likely due to the aliasing introduced when windowing near-nyquist frequencies.
        // For purity, detect and remove these unwanted changes to the input signal.
        // The effect on peak control is < 0.1% or -60dB. Oversampling is not exact anyway.
        float max_out_diff = 0;
        for (int i = 0; i < this->overlap; i++) {
            max_out_diff = std::max(max_out_diff, std::abs(out_samples[i]));
        }
        if (max_out_diff < this->clip_level * 0.001) {
            for (int i = 0; i < this->overlap; i++) {
                out_samples[i] = 0;
            }
        }
    }

    if (!diff_only) {
        for (int i = 0; i < this->overlap; i++) {
            out_samples[i] += this->in_frame[i];
        }
    }
}